

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O1

SizeData * __thiscall
Rml::ElementHandleTargetData::GetSizeData
          (SizeData *__return_storage_ptr__,ElementHandleTargetData *this,Vector2f *drag_delta_min,
          Vector2f *drag_delta_max)

{
  ComputedValues *pCVar1;
  ulong uVar2;
  Vector2f VVar3;
  Vector2f VVar4;
  Vector2f b;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_78;
  float fStack_74;
  float local_58;
  float fStack_54;
  
  (__return_storage_ptr__->original_size).x = 0.0;
  (__return_storage_ptr__->original_size).y = 0.0;
  (__return_storage_ptr__->original_position_bottom_right).x = 0.0;
  (__return_storage_ptr__->original_position_bottom_right).y = 0.0;
  (__return_storage_ptr__->width_height).x = false;
  (__return_storage_ptr__->width_height).y = false;
  (__return_storage_ptr__->bottom_right).x = false;
  (__return_storage_ptr__->bottom_right).y = false;
  VVar3 = Box::GetSize(this->box,
                       (uint)((*(uint *)&this->computed->common >> 0x10 & 1) == 0) * 2 + Border);
  __return_storage_ptr__->original_size = VVar3;
  fVar7 = GetPositionRight(this);
  fVar8 = GetPositionBottom(this);
  (__return_storage_ptr__->original_position_bottom_right).x = fVar7;
  (__return_storage_ptr__->original_position_bottom_right).y = fVar8;
  pCVar1 = this->computed;
  uVar2 = *(ulong *)&pCVar1->common;
  bVar5 = (uVar2 >> 0x24 & 3) == 0;
  (__return_storage_ptr__->bottom_right).x = !bVar5;
  bVar6 = (uVar2 >> 0x26 & 3) == 0;
  (__return_storage_ptr__->bottom_right).y = !bVar6;
  (__return_storage_ptr__->width_height).x =
       ((uVar2 & 0x60000) != 0 || (uVar2 & 0x30000000000) == 0) || bVar5;
  (__return_storage_ptr__->width_height).y =
       ((uVar2 & 0x180000) != 0 || (uVar2 & 0xc00000000) == 0) || bVar6;
  fVar7 = ResolveValueOr((LengthPercentage)
                         (CONCAT44((pCVar1->rare).min_width,*(undefined4 *)&pCVar1->rare) &
                         0xffffffff00000001),(this->containing_block).x,0.0);
  fVar8 = ResolveValueOr((LengthPercentage)
                         (CONCAT44((this->computed->rare).min_height,
                                   *(uint *)&this->computed->rare >> 2) & 0xffffffff00000001),
                         (this->containing_block).y,0.0);
  fVar9 = ResolveValueOr((LengthPercentage)
                         (CONCAT44((this->computed->rare).max_width,
                                   *(uint *)&this->computed->rare >> 1) & 0xffffffff00000001),
                         (this->containing_block).x,3.4028235e+38);
  fVar10 = ResolveValueOr((LengthPercentage)
                          (CONCAT44((this->computed->rare).max_height,
                                    *(uint *)&this->computed->rare >> 3) & 0xffffffff00000001),
                          (this->containing_block).y,3.4028235e+38);
  VVar4 = DistanceToTopLeft(this);
  VVar4 = DistanceToBottomRight(this,VVar4);
  local_78 = VVar3.x;
  fStack_74 = VVar3.y;
  VVar3.y = fVar8 - fStack_74;
  VVar3.x = fVar7 - local_78;
  VVar3 = Math::Max<Rml::Vector2<float>>(*drag_delta_min,VVar3);
  *drag_delta_min = VVar3;
  b.y = fVar10 - fStack_74;
  b.x = fVar9 - local_78;
  VVar3 = Math::Min<Rml::Vector2<float>>(*drag_delta_max,b);
  *drag_delta_max = VVar3;
  local_58 = VVar4.x;
  fStack_54 = VVar4.y;
  VVar4.y = fStack_54 - (this->resolved_edge_margin)._M_elems[2];
  VVar4.x = local_58 - (this->resolved_edge_margin)._M_elems[1];
  VVar3 = Math::Min<Rml::Vector2<float>>(VVar3,VVar4);
  *drag_delta_max = VVar3;
  return __return_storage_ptr__;
}

Assistant:

SizeData GetSizeData(Vector2f& drag_delta_min, Vector2f& drag_delta_max) const
	{
		using namespace Style;
		SizeData data = {};

		data.original_size = box.GetSize(computed.box_sizing() == BoxSizing::BorderBox ? BoxArea::Border : BoxArea::Content);
		data.original_position_bottom_right = {GetPositionRight(), GetPositionBottom()};

		data.bottom_right.x = (computed.right().type != Right::Auto);
		data.bottom_right.y = (computed.bottom().type != Bottom::Auto);
		data.width_height.x = (computed.left().type == Left::Auto || computed.right().type == Right::Auto || computed.width().type != Width::Auto);
		data.width_height.y = (computed.top().type == Top::Auto || computed.bottom().type == Bottom::Auto || computed.height().type != Height::Auto);

		const Vector2f min_size = {
			ResolveValue(computed.min_width(), containing_block.x),
			ResolveValue(computed.min_height(), containing_block.y),
		};
		const Vector2f max_size = {
			ResolveValueOr(computed.max_width(), containing_block.x, FLT_MAX),
			ResolveValueOr(computed.max_height(), containing_block.y, FLT_MAX),
		};
		const Vector2f distance_to_bottom_right = DistanceToBottomRight(DistanceToTopLeft());

		drag_delta_min = Math::Max(drag_delta_min, min_size - data.original_size);
		drag_delta_max = Math::Min(drag_delta_max, max_size - data.original_size);
		drag_delta_max = Math::Min(drag_delta_max, Vector2f{-resolved_edge_margin[RIGHT], -resolved_edge_margin[BOTTOM]} + distance_to_bottom_right);

		return data;
	}